

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O3

shared_ptr<helics::BrokerFactory::BrokerBuilder> *
helics::BrokerFactory::MasterBrokerBuilder::getDefaultBuilder(void)

{
  element_type *peVar1;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>
  *builder;
  shared_ptr<helics::BrokerFactory::MasterBrokerBuilder> *psVar2;
  shared_ptr<helics::BrokerFactory::MasterBrokerBuilder> *psVar3;
  pointer ptVar4;
  HelicsException *this;
  string_view message;
  
  psVar2 = instance();
  psVar3 = instance();
  peVar1 = (psVar3->
           super___shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  for (ptVar4 = (peVar1->builders).
                super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ptVar4 != (peVar1->builders).
                super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ptVar4 = ptVar4 + 1) {
    if ((ptVar4->
        super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>
        ).super__Head_base<0UL,_int,_false>._M_head_impl < 0xb) {
      return (shared_ptr<helics::BrokerFactory::BrokerBuilder> *)ptVar4;
    }
  }
  peVar1 = (psVar2->
           super___shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  ptVar4 = (peVar1->builders).
           super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ptVar4 != (peVar1->builders).
                super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    return (shared_ptr<helics::BrokerFactory::BrokerBuilder> *)ptVar4;
  }
  this = (HelicsException *)__cxa_allocate_exception(0x28);
  message._M_str = "core type is not available";
  message._M_len = 0x1a;
  HelicsException::HelicsException(this,message);
  __cxa_throw(this,&HelicsException::typeinfo,HelicsException::~HelicsException);
}

Assistant:

static const std::shared_ptr<BrokerBuilder>& getDefaultBuilder()
    {
        const auto& blder = instance();
        for (auto& builder : instance()->builders) {
            if (std::get<0>(builder) <= 10) {
                return std::get<2>(builder);
            }
        }
        if (blder->builders.empty()) {
            throw(HelicsException("core type is not available"));
        }
        return std::get<2>(blder->builders[0]);
    }